

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfRgbaYca.cpp
# Opt level: O2

void __thiscall
Imf_3_4::RgbaYca::roundYCA(RgbaYca *this,int n,uint roundY,uint roundC,Rgba *ycaIn,Rgba *ycaOut)

{
  uint16_t extraout_AX;
  uint16_t extraout_AX_00;
  uint16_t extraout_AX_01;
  undefined4 in_register_0000000c;
  ulong uVar1;
  ulong uVar2;
  half *this_00;
  double in_XMM0_Qa;
  double __x;
  
  uVar2 = 0;
  uVar1 = (ulong)this & 0xffffffff;
  if ((int)this < 1) {
    uVar1 = uVar2;
  }
  this_00 = (half *)(CONCAT44(in_register_0000000c,roundC) + 4);
  for (; uVar1 != uVar2; uVar2 = uVar2 + 1) {
    in_XMM0_Qa = Imath_3_2::half::round(this_00 + -1,in_XMM0_Qa);
    ycaIn[uVar2].g._h = extraout_AX;
    ycaIn[uVar2].a._h = this_00[1]._h;
    if ((uVar2 & 1) == 0) {
      __x = Imath_3_2::half::round(this_00 + -2,in_XMM0_Qa);
      ycaIn[uVar2].r._h = extraout_AX_00;
      in_XMM0_Qa = Imath_3_2::half::round(this_00,__x);
      ycaIn[uVar2].b._h = extraout_AX_01;
    }
    this_00 = this_00 + 4;
  }
  return;
}

Assistant:

void
roundYCA (
    int          n,
    unsigned int roundY,
    unsigned int roundC,
    const Rgba   ycaIn[/*n*/],
    Rgba         ycaOut[/*n*/])
{
    for (int i = 0; i < n; ++i)
    {
        ycaOut[i].g = ycaIn[i].g.round (roundY);
        ycaOut[i].a = ycaIn[i].a;

        if ((i & 1) == 0)
        {
            ycaOut[i].r = ycaIn[i].r.round (roundC);
            ycaOut[i].b = ycaIn[i].b.round (roundC);
        }
    }
}